

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  uint64_t *puVar6;
  uint uVar7;
  uint offset;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  secp256k1_scalar s;
  
  puVar6 = (uint64_t *)CONCAT44(in_register_00000034,len);
  iVar10 = 0;
  memset(wnaf,0,0x204);
  s.d[2] = puVar6[2];
  s.d[3] = puVar6[3];
  s.d[0] = *puVar6;
  s.d[1] = puVar6[1];
  uVar5 = 0xffffffffffffffff;
  if ((long)puVar6[3] < 0) {
    secp256k1_scalar_negate(&s,&s);
    iVar3 = -1;
  }
  else {
    iVar3 = 1;
  }
  uVar4 = (uint)a;
  uVar7 = 0;
  do {
    uVar8 = (ulong)iVar10;
    uVar9 = 0x81 - iVar10;
    while( true ) {
      offset = (uint)uVar8;
      if (0x80 < (int)offset) {
        return (int)uVar5 + 1;
      }
      if (((s.d[uVar8 >> 6 & 0x3ffffff] >> (uVar8 & 0x3f) & 1) != 0) != uVar7) break;
      uVar8 = uVar8 + 1;
      uVar9 = uVar9 - 1;
    }
    uVar2 = 0x81 - offset;
    if ((int)uVar4 <= (int)(0x81 - offset)) {
      uVar2 = uVar4;
    }
    uVar1 = secp256k1_scalar_get_bits_var(&s,offset,uVar2);
    uVar2 = uVar1 + uVar7;
    bVar11 = (uVar2 >> (uVar4 - 1 & 0x1f) & 1) != 0;
    uVar7 = (uint)bVar11;
    wnaf[uVar8] = (uVar2 - ((uint)bVar11 << ((byte)a & 0x1f))) * iVar3;
    if ((int)uVar4 < (int)uVar9) {
      uVar9 = uVar4;
    }
    iVar10 = uVar9 + offset;
    uVar5 = uVar8 & 0xffffffff;
  } while( true );
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}